

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O2

void print_info(output_data_switch query,cpu_id_t *data)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  FILE *pFVar5;
  char *__format;
  char *pcVar6;
  ulong uVar7;
  size_t sStack_30;
  
  if ((data == (cpu_id_t *)0x0) && (iVar1 = check_need_raw_data(), iVar1 != 0)) {
    pcVar6 = "print_info: raw data is required but not provided.\n";
    sStack_30 = 0x33;
    pFVar5 = _stderr;
LAB_00103e9e:
    fwrite(pcVar6,sStack_30,1,pFVar5);
    return;
  }
  pFVar5 = (FILE *)fout;
  switch(query) {
  case NEED_CPUID_PRESENT:
    uVar2 = cpuid_present();
    goto LAB_00103c4c;
  case NEED_ARCHITECTURE:
    pcVar6 = (char *)cpu_architecture_str(data->architecture);
    goto LAB_00103a97;
  case NEED_FEATURE_LEVEL:
    pcVar6 = (char *)cpu_feature_level_str(data->feature_level);
    goto LAB_00103a97;
  case NEED_PURPOSE:
    pcVar6 = (char *)cpu_purpose_str(data->purpose);
LAB_00103a97:
    __format = "%s\n";
LAB_00103c31:
    fprintf(pFVar5,__format,pcVar6);
    return;
  case NEED_VENDOR_STR:
    pcVar6 = data->vendor_str;
    goto LAB_00103b6e;
  case NEED_VENDOR_ID:
    uVar7 = (ulong)(uint)data->vendor;
    break;
  case NEED_BRAND_STRING:
    pcVar6 = data->brand_str;
    goto LAB_00103b6e;
  case NEED_FAMILY:
    uVar7 = (ulong)(uint)(data->field_11).x86.family;
    break;
  case NEED_MODEL:
    uVar7 = (ulong)(uint)(data->field_11).x86.model;
    break;
  case NEED_STEPPING:
    uVar7 = (ulong)(uint)(data->field_11).x86.stepping;
    break;
  case NEED_EXT_FAMILY:
    uVar7 = (ulong)(uint)(data->field_11).x86.ext_family;
    break;
  case NEED_EXT_MODEL:
    uVar7 = (ulong)(uint)(data->field_11).x86.ext_model;
    break;
  case NEED_IMPLEMENTER:
    uVar7 = (ulong)(data->field_11).arm.implementer;
    break;
  case NEED_VARIANT:
    uVar7 = (ulong)(data->field_11).arm.variant;
    break;
  case NEED_PART_NUM:
    uVar7 = (ulong)(data->field_11).arm.part_num;
    break;
  case NEED_REVISION:
    uVar7 = (ulong)(data->field_11).arm.revision;
    break;
  case NEED_NUM_CORES:
    uVar7 = (ulong)(uint)data->num_cores;
    break;
  case NEED_NUM_LOGICAL:
    uVar7 = (ulong)(uint)data->num_logical_cpus;
    break;
  case NEED_TOTAL_CPUS:
    uVar2 = cpuid_get_total_cpus();
    goto LAB_00103c4c;
  case NEED_AFFI_MASK:
    pcVar6 = (char *)affinity_mask_str(&data->affinity_mask);
    __format = "0x%s\n";
    goto LAB_00103c31;
  case NEED_L1D_SIZE:
    uVar7 = (ulong)(uint)data->l1_data_cache;
    break;
  case NEED_L1I_SIZE:
    uVar7 = (ulong)(uint)data->l1_instruction_cache;
    break;
  case NEED_L2_SIZE:
    uVar7 = (ulong)(uint)data->l2_cache;
    break;
  case NEED_L3_SIZE:
    uVar7 = (ulong)(uint)data->l3_cache;
    break;
  case NEED_L4_SIZE:
    uVar7 = (ulong)(uint)data->l4_cache;
    break;
  case NEED_L1D_ASSOC:
    uVar7 = (ulong)(uint)data->l1_data_assoc;
    break;
  case NEED_L1I_ASSOC:
    uVar7 = (ulong)(uint)data->l1_instruction_assoc;
    break;
  case NEED_L2_ASSOC:
    uVar7 = (ulong)(uint)data->l2_assoc;
    break;
  case NEED_L3_ASSOC:
    uVar7 = (ulong)(uint)data->l3_assoc;
    break;
  case NEED_L4_ASSOC:
    uVar7 = (ulong)(uint)data->l4_assoc;
    break;
  case NEED_L1D_CACHELINE:
    uVar7 = (ulong)(uint)data->l1_data_cacheline;
    break;
  case NEED_L1I_CACHELINE:
    uVar7 = (ulong)(uint)data->l1_instruction_cacheline;
    break;
  case NEED_L2_CACHELINE:
    uVar7 = (ulong)(uint)data->l2_cacheline;
    break;
  case NEED_L3_CACHELINE:
    uVar7 = (ulong)(uint)data->l3_cacheline;
    break;
  case NEED_L4_CACHELINE:
    uVar7 = (ulong)(uint)data->l4_cacheline;
    break;
  case NEED_L1D_INSTANCES:
    uVar7 = (ulong)(uint)data->l1_data_instances;
    break;
  case NEED_L1I_INSTANCES:
    uVar7 = (ulong)(uint)data->l1_instruction_instances;
    break;
  case NEED_L2_INSTANCES:
    uVar7 = (ulong)(uint)data->l2_instances;
    break;
  case NEED_L3_INSTANCES:
    uVar7 = (ulong)(uint)data->l3_instances;
    break;
  case NEED_L4_INSTANCES:
    uVar7 = (ulong)(uint)data->l4_instances;
    break;
  case NEED_CODENAME:
    pcVar6 = data->cpu_codename;
LAB_00103b6e:
    __format = "%s\n";
    goto LAB_00103c31;
  case NEED_FEATURES:
    for (uVar7 = 0; __stream = fout, uVar7 != 0x150; uVar7 = uVar7 + 1) {
      if (data->flags[uVar7] != '\0') {
        uVar4 = cpu_feature_str(uVar7 & 0xffffffff);
        fprintf((FILE *)__stream," %s",uVar4);
      }
    }
    fputc(10,(FILE *)fout);
    return;
  case NEED_CLOCK:
    uVar2 = cpu_clock();
    goto LAB_00103c4c;
  case NEED_CLOCK_OS:
    uVar2 = cpu_clock_by_os();
    goto LAB_00103c4c;
  case NEED_CLOCK_RDTSC:
    uVar2 = cpu_clock_measure(400,1);
    goto LAB_00103c4c;
  case NEED_CLOCK_IC:
    uVar2 = cpu_clock_by_ic(0x19,0x10);
LAB_00103c4c:
    uVar7 = (ulong)uVar2;
    break;
  case NEED_RDMSR:
    lVar3 = cpu_msr_driver_open();
    if (lVar3 != 0) {
      uVar2 = cpu_msrinfo(lVar3,0);
      if (uVar2 != 0x3fffffff) {
        fprintf((FILE *)fout,"  MSR.mperf  : %d MHz\n",(ulong)uVar2);
      }
      uVar2 = cpu_msrinfo(lVar3,1);
      if (uVar2 != 0x3fffffff) {
        fprintf((FILE *)fout,"  MSR.aperf  : %d MHz\n",(ulong)uVar2);
      }
      iVar1 = cpu_msrinfo(lVar3,2);
      if (iVar1 != 0x3fffffff) {
        fprintf((FILE *)fout,"  min. multi.: %.2lf\n",(double)iVar1 / 100.0);
      }
      iVar1 = cpu_msrinfo(lVar3,3);
      if (iVar1 != 0x3fffffff) {
        fprintf((FILE *)fout,"  cur. multi.: %.2lf\n",(double)iVar1 / 100.0);
      }
      iVar1 = cpu_msrinfo(lVar3,4);
      if (iVar1 != 0x3fffffff) {
        fprintf((FILE *)fout,"  max. multi.: %.2lf\n",(double)iVar1 / 100.0);
      }
      uVar2 = cpu_msrinfo(lVar3,5);
      if (uVar2 != 0x3fffffff) {
        fprintf((FILE *)fout,"  temperature: %d degrees Celsius\n",(ulong)uVar2);
      }
      iVar1 = cpu_msrinfo(lVar3,6);
      if (iVar1 != 0x3fffffff) {
        pcVar6 = "yes";
        if (iVar1 == 0) {
          pcVar6 = "no";
        }
        fprintf((FILE *)fout,"  throttling : %s\n",pcVar6);
      }
      iVar1 = cpu_msrinfo(lVar3,7);
      if (iVar1 != 0x3fffffff) {
        fprintf((FILE *)fout,"  core volt. : %.2lf Volts\n",(double)iVar1 / 100.0);
      }
      iVar1 = cpu_msrinfo(lVar3,9);
      if (iVar1 != 0x3fffffff) {
        fprintf((FILE *)fout,"  bus clock  : %.2lf MHz\n",(double)iVar1 / 100.0);
      }
LAB_00103e7e:
      cpu_msr_driver_close(lVar3);
      return;
    }
    goto LAB_00103eaf;
  case NEED_RDMSR_RAW:
    lVar3 = cpu_msr_driver_open();
    if (lVar3 != 0) {
      msr_serialize_raw_data(lVar3,"");
      goto LAB_00103e7e;
    }
LAB_00103eaf:
    pFVar5 = (FILE *)fout;
    pcVar6 = (char *)cpuid_error();
    __format = "Cannot open MSR driver: %s\n";
    goto LAB_00103c31;
  case NEED_SSE_UNIT_SIZE:
    pcVar6 = "authoritative";
    if (data->detection_hints[0] == '\0') {
      pcVar6 = "non-authoritative";
    }
    fprintf((FILE *)fout,"%d (%s)\n",(ulong)(uint)(data->field_11).x86.sse_size,pcVar6);
    return;
  default:
    pcVar6 = "How did you get here?!?\n";
    sStack_30 = 0x18;
    goto LAB_00103e9e;
  }
  fprintf(pFVar5,"%d\n",uVar7);
  return;
}

Assistant:

static void print_info(output_data_switch query, struct cpu_id_t* data)
{
	int i, value;
	struct msr_driver_t* handle;

	/* Check if function is properly called */
	if ((data == NULL) && check_need_raw_data()) {
		fprintf(stderr, "print_info: raw data is required but not provided.\n");
		return;
	}

	switch (query) {
		case NEED_CPUID_PRESENT:
			fprintf(fout, "%d\n", cpuid_present());
			break;
		case NEED_ARCHITECTURE:
			fprintf(fout, "%s\n", cpu_architecture_str(data->architecture));
			break;
		case NEED_FEATURE_LEVEL:
			fprintf(fout, "%s\n", cpu_feature_level_str(data->feature_level));
			break;
		case NEED_PURPOSE:
			fprintf(fout, "%s\n", cpu_purpose_str(data->purpose));
			break;
		case NEED_VENDOR_STR:
			fprintf(fout, "%s\n", data->vendor_str);
			break;
		case NEED_VENDOR_ID:
			fprintf(fout, "%d\n", data->vendor);
			break;
		case NEED_BRAND_STRING:
			fprintf(fout, "%s\n", data->brand_str);
			break;
		case NEED_FAMILY:
			fprintf(fout, "%d\n", data->x86.family);
			break;
		case NEED_MODEL:
			fprintf(fout, "%d\n", data->x86.model);
			break;
		case NEED_STEPPING:
			fprintf(fout, "%d\n", data->x86.stepping);
			break;
		case NEED_EXT_FAMILY:
			fprintf(fout, "%d\n", data->x86.ext_family);
			break;
		case NEED_EXT_MODEL:
			fprintf(fout, "%d\n", data->x86.ext_model);
			break;
		case NEED_IMPLEMENTER:
			fprintf(fout, "%d\n", data->arm.implementer);
			break;
		case NEED_VARIANT:
			fprintf(fout, "%d\n", data->arm.variant);
			break;
		case NEED_PART_NUM:
			fprintf(fout, "%d\n", data->arm.part_num);
			break;
		case NEED_REVISION:
			fprintf(fout, "%d\n", data->arm.revision);
			break;
		case NEED_NUM_CORES:
			fprintf(fout, "%d\n", data->num_cores);
			break;
		case NEED_NUM_LOGICAL:
			fprintf(fout, "%d\n", data->num_logical_cpus);
			break;
		case NEED_TOTAL_CPUS:
			fprintf(fout, "%d\n", cpuid_get_total_cpus());
			break;
		case NEED_AFFI_MASK:
			fprintf(fout, "0x%s\n", affinity_mask_str(&data->affinity_mask));
			break;
		case NEED_L1D_SIZE:
			fprintf(fout, "%d\n", data->l1_data_cache);
			break;
		case NEED_L1I_SIZE:
			fprintf(fout, "%d\n", data->l1_instruction_cache);
			break;
		case NEED_L2_SIZE:
			fprintf(fout, "%d\n", data->l2_cache);
			break;
		case NEED_L3_SIZE:
			fprintf(fout, "%d\n", data->l3_cache);
			break;
		case NEED_L4_SIZE:
			fprintf(fout, "%d\n", data->l4_cache);
			break;
		case NEED_L1D_ASSOC:
			fprintf(fout, "%d\n", data->l1_data_assoc);
			break;
		case NEED_L1I_ASSOC:
			fprintf(fout, "%d\n", data->l1_instruction_assoc);
			break;
		case NEED_L2_ASSOC:
			fprintf(fout, "%d\n", data->l2_assoc);
			break;
		case NEED_L3_ASSOC:
			fprintf(fout, "%d\n", data->l3_assoc);
			break;
		case NEED_L4_ASSOC:
			fprintf(fout, "%d\n", data->l4_assoc);
			break;
		case NEED_L1D_CACHELINE:
			fprintf(fout, "%d\n", data->l1_data_cacheline);
			break;
		case NEED_L1I_CACHELINE:
			fprintf(fout, "%d\n", data->l1_instruction_cacheline);
			break;
		case NEED_L2_CACHELINE:
			fprintf(fout, "%d\n", data->l2_cacheline);
			break;
		case NEED_L3_CACHELINE:
			fprintf(fout, "%d\n", data->l3_cacheline);
			break;
		case NEED_L4_CACHELINE:
			fprintf(fout, "%d\n", data->l4_cacheline);
			break;
		case NEED_L1D_INSTANCES:
			fprintf(fout, "%d\n", data->l1_data_instances);
			break;
		case NEED_L1I_INSTANCES:
			fprintf(fout, "%d\n", data->l1_instruction_instances);
			break;
		case NEED_L2_INSTANCES:
			fprintf(fout, "%d\n", data->l2_instances);
			break;
		case NEED_L3_INSTANCES:
			fprintf(fout, "%d\n", data->l3_instances);
			break;
		case NEED_L4_INSTANCES:
			fprintf(fout, "%d\n", data->l4_instances);
			break;
		case NEED_CODENAME:
			fprintf(fout, "%s\n", data->cpu_codename);
			break;
		case NEED_FEATURES:
		{
			for (i = 0; i < NUM_CPU_FEATURES; i++)
				if (data->flags[i])
					fprintf(fout, " %s", cpu_feature_str(i));
			fprintf(fout, "\n");
			break;
		}
		case NEED_CLOCK:
			fprintf(fout, "%d\n", cpu_clock());
			break;
		case NEED_CLOCK_OS:
			fprintf(fout, "%d\n", cpu_clock_by_os());
			break;
		case NEED_CLOCK_RDTSC:
			fprintf(fout, "%d\n", cpu_clock_measure(400, 1));
			break;
		case NEED_CLOCK_IC:
			fprintf(fout, "%d\n", cpu_clock_by_ic(25, 16));
			break;
		case NEED_RDMSR:
		{
			if ((handle = cpu_msr_driver_open()) == NULL) {
				fprintf(fout, "Cannot open MSR driver: %s\n", cpuid_error());
			} else {
				if ((value = cpu_msrinfo(handle, INFO_MPERF)) != CPU_INVALID_VALUE)
					fprintf(fout, "  MSR.mperf  : %d MHz\n", value);
				if ((value = cpu_msrinfo(handle, INFO_APERF)) != CPU_INVALID_VALUE)
					fprintf(fout, "  MSR.aperf  : %d MHz\n", value);
				if ((value = cpu_msrinfo(handle, INFO_MIN_MULTIPLIER)) != CPU_INVALID_VALUE)
					fprintf(fout, "  min. multi.: %.2lf\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_CUR_MULTIPLIER)) != CPU_INVALID_VALUE)
					fprintf(fout, "  cur. multi.: %.2lf\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_MAX_MULTIPLIER)) != CPU_INVALID_VALUE)
					fprintf(fout, "  max. multi.: %.2lf\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_TEMPERATURE)) != CPU_INVALID_VALUE)
					fprintf(fout, "  temperature: %d degrees Celsius\n", value);
				if ((value = cpu_msrinfo(handle, INFO_THROTTLING)) != CPU_INVALID_VALUE)
					fprintf(fout, "  throttling : %s\n", value ? "yes" : "no");
				if ((value = cpu_msrinfo(handle, INFO_VOLTAGE)) != CPU_INVALID_VALUE)
					fprintf(fout, "  core volt. : %.2lf Volts\n", value / 100.0);
				if ((value = cpu_msrinfo(handle, INFO_BUS_CLOCK)) != CPU_INVALID_VALUE)
					fprintf(fout, "  bus clock  : %.2lf MHz\n", value / 100.0);
				cpu_msr_driver_close(handle);
			}
			break;
		}
		case NEED_RDMSR_RAW:
		{
			if ((handle = cpu_msr_driver_open()) == NULL) {
				fprintf(fout, "Cannot open MSR driver: %s\n", cpuid_error());
			} else {
				msr_serialize_raw_data(handle, "");
				cpu_msr_driver_close(handle);
			}
			break;
		}
		case NEED_SSE_UNIT_SIZE:
		{
			fprintf(fout, "%d (%s)\n", data->x86.sse_size,
				data->detection_hints[CPU_HINT_SSE_SIZE_AUTH] ? "authoritative" : "non-authoritative");
			break;
		}
		default:
			fprintf(fout, "How did you get here?!?\n");
			break;
	}
}